

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int decodeFlags(MemPage *pPage,int flagByte)

{
  BtShared *pBVar1;
  undefined4 uVar2;
  int iVar3;
  code *pcVar4;
  
  pBVar1 = pPage->pBt;
  pPage->max1bytePayload = pBVar1->max1bytePayload;
  if (flagByte < 10) {
    pPage->childPtrSize = '\x04';
    pPage->leaf = '\0';
    if (flagByte != 5) {
      if (flagByte != 2) {
        pPage->intKey = '\0';
        pPage->intKeyLeaf = '\0';
        pPage->xCellSize = cellSizePtr;
        pPage->xParseCell = btreeParseCellPtrIndex;
        iVar3 = sqlite3CorruptError(0x11c98);
        return iVar3;
      }
      pPage->intKey = '\0';
      pPage->intKeyLeaf = '\0';
      pcVar4 = cellSizePtr;
      goto LAB_00137e27;
    }
    pPage->xCellSize = cellSizePtrNoPayload;
    pPage->xParseCell = btreeParseCellPtrNoPayload;
    pPage->intKey = '\x01';
    pPage->intKeyLeaf = '\0';
  }
  else {
    pPage->childPtrSize = '\0';
    pPage->leaf = '\x01';
    if (flagByte == 10) {
      pPage->intKey = '\0';
      pPage->intKeyLeaf = '\0';
      pcVar4 = cellSizePtrIdxLeaf;
LAB_00137e27:
      pPage->xCellSize = pcVar4;
      pPage->xParseCell = btreeParseCellPtrIndex;
      uVar2._0_2_ = pBVar1->maxLocal;
      uVar2._2_2_ = pBVar1->minLocal;
      goto LAB_00137e60;
    }
    if (flagByte != 0xd) {
      pPage->intKey = '\0';
      pPage->intKeyLeaf = '\0';
      pPage->xCellSize = cellSizePtrIdxLeaf;
      pPage->xParseCell = btreeParseCellPtrIndex;
      iVar3 = sqlite3CorruptError(0x11c80);
      return iVar3;
    }
    pPage->xCellSize = cellSizePtrTableLeaf;
    pPage->xParseCell = btreeParseCellPtr;
    pPage->intKey = '\x01';
    pPage->intKeyLeaf = '\x01';
  }
  uVar2._0_2_ = pBVar1->maxLeaf;
  uVar2._2_2_ = pBVar1->minLeaf;
LAB_00137e60:
  pPage->maxLocal = (short)uVar2;
  pPage->minLocal = (short)((uint)uVar2 >> 0x10);
  return 0;
}

Assistant:

static int decodeFlags(MemPage *pPage, int flagByte){
  BtShared *pBt;     /* A copy of pPage->pBt */

  assert( pPage->hdrOffset==(pPage->pgno==1 ? 100 : 0) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  pBt = pPage->pBt;
  pPage->max1bytePayload = pBt->max1bytePayload;
  if( flagByte>=(PTF_ZERODATA | PTF_LEAF) ){
    pPage->childPtrSize = 0;
    pPage->leaf = 1;
    if( flagByte==(PTF_LEAFDATA | PTF_INTKEY | PTF_LEAF) ){
      pPage->intKeyLeaf = 1;
      pPage->xCellSize = cellSizePtrTableLeaf;
      pPage->xParseCell = btreeParseCellPtr;
      pPage->intKey = 1;
      pPage->maxLocal = pBt->maxLeaf;
      pPage->minLocal = pBt->minLeaf;
    }else if( flagByte==(PTF_ZERODATA | PTF_LEAF) ){
      pPage->intKey = 0;
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtrIdxLeaf;
      pPage->xParseCell = btreeParseCellPtrIndex;
      pPage->maxLocal = pBt->maxLocal;
      pPage->minLocal = pBt->minLocal;
    }else{
      pPage->intKey = 0;
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtrIdxLeaf;
      pPage->xParseCell = btreeParseCellPtrIndex;
      return SQLITE_CORRUPT_PAGE(pPage);
    }
  }else{
    pPage->childPtrSize = 4;
    pPage->leaf = 0;
    if( flagByte==(PTF_ZERODATA) ){
      pPage->intKey = 0;
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtr;
      pPage->xParseCell = btreeParseCellPtrIndex;
      pPage->maxLocal = pBt->maxLocal;
      pPage->minLocal = pBt->minLocal;
    }else if( flagByte==(PTF_LEAFDATA | PTF_INTKEY) ){
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtrNoPayload;
      pPage->xParseCell = btreeParseCellPtrNoPayload;
      pPage->intKey = 1;
      pPage->maxLocal = pBt->maxLeaf;
      pPage->minLocal = pBt->minLeaf;
    }else{
      pPage->intKey = 0;
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtr;
      pPage->xParseCell = btreeParseCellPtrIndex;
      return SQLITE_CORRUPT_PAGE(pPage);
    }
  }
  return SQLITE_OK;
}